

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscDecompiler.cpp
# Opt level: O3

void NscScriptDecompile(CNwnStream *sStream,uchar *pauchData,unsigned_long ulSize,
                       NscCompiler *pCompiler)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  ushort uVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte *pbVar7;
  char *pcVar8;
  ulong uVar9;
  char *pcVar10;
  size_t __n;
  ulong uVar11;
  byte *pbVar12;
  byte *pbVar13;
  float fVar14;
  char *pcVar15;
  uchar *pStart;
  char szByteText [128];
  char szOpType [32];
  char szOpText [512];
  char szText [1024];
  char local_6e8 [128];
  char local_668 [32];
  NscCompiler *local_648;
  CNwnStream *local_640;
  undefined8 local_638;
  undefined2 local_630;
  char local_438 [1032];
  
  if (8 < (long)ulSize) {
    pbVar5 = pauchData + ulSize;
    pbVar7 = pauchData + 8;
    local_648 = pCompiler;
    local_640 = sStream;
    do {
      pbVar6 = pbVar7 + 1;
      uVar11 = (ulong)*pbVar7;
      pcVar10 = "RSADD";
      pcVar15 = "LOGAND";
      switch(*pbVar7) {
      case 1:
        if ((pbVar5 < pbVar7 + 8) || (*pbVar6 != 1)) break;
        uVar3 = *(uint *)(pbVar7 + 2);
        pcVar10 = (char *)(ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                                 uVar3 << 0x18);
        pcVar15 = (char *)(ulong)(ushort)(*(ushort *)(pbVar7 + 6) << 8 |
                                         *(ushort *)(pbVar7 + 6) >> 8);
        sprintf(local_6e8,"%02X 01 %08X %04X",1,pcVar10,pcVar15);
        pcVar8 = "CPDOWNSP %08X, %04X";
LAB_00147204:
        pbVar13 = pbVar7 + 8;
        goto LAB_00147212;
      case 2:
        goto switchD_00146b7c_caseD_2;
      case 3:
        if ((pbVar7 + 8 <= pbVar5) && (*pbVar6 == 1)) {
          uVar3 = *(uint *)(pbVar7 + 2);
          pcVar10 = (char *)(ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8
                                   | uVar3 << 0x18);
          pcVar15 = (char *)(ulong)(ushort)(*(ushort *)(pbVar7 + 6) << 8 |
                                           *(ushort *)(pbVar7 + 6) >> 8);
          sprintf(local_6e8,"%02X 01 %08X %04X",3,pcVar10,pcVar15);
          pcVar8 = "CPTOPSP %08X, %04X";
          goto LAB_00147204;
        }
        break;
      case 4:
        if (pbVar7 + 2 <= pbVar5) {
          bVar1 = *pbVar6;
          GetOpText(bVar1,local_668);
          switch(bVar1) {
          case 3:
          case 6:
            pbVar13 = pbVar7 + 6;
            if (pbVar13 <= pbVar5) {
              uVar3 = *(uint *)(pbVar7 + 2);
              pcVar15 = (char *)(ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 |
                                        (uVar3 & 0xff00) << 8 | uVar3 << 0x18);
              sprintf(local_6e8,"%02X %02X %08X",4,(ulong)bVar1,pcVar15);
              pcVar8 = "CONST%s %08X";
              pcVar10 = local_668;
              goto LAB_00147212;
            }
            break;
          case 4:
            pbVar13 = pbVar7 + 6;
            if (pbVar13 <= pbVar5) {
              uVar3 = *(uint *)(pbVar7 + 2);
              fVar14 = (float)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                              uVar3 << 0x18);
              sprintf(local_6e8,"%02X %02X %08X",4,4,(ulong)(uint)fVar14);
              sprintf((char *)&local_638,"CONST%s %f",(double)fVar14,local_668);
              goto LAB_0014751d;
            }
            break;
          case 5:
            pbVar13 = pbVar7 + 4;
            if ((pbVar13 <= pbVar5) &&
               (uVar9 = (ulong)(ushort)(*(ushort *)(pbVar7 + 2) << 8 | *(ushort *)(pbVar7 + 2) >> 8)
               , pbVar6 + uVar9 + 3 <= pbVar5)) {
              __n = 0x80;
              if (uVar9 < 0x80) {
                __n = uVar9;
              }
              memmove(local_438,pbVar13,__n);
              local_438[__n] = '\0';
              sprintf(local_6e8,"%02X %02X %04X str",4,5,uVar9);
              snprintf((char *)&local_638,0x200,"CONST%s \"%s\"",local_668,local_438);
              pbVar13 = pbVar13 + uVar9;
              goto LAB_0014751d;
            }
          }
        }
        break;
      case 5:
        pbVar12 = pbVar7 + 5;
        if ((pbVar5 < pbVar12) || (*pbVar6 != 0)) break;
        uVar4 = *(ushort *)(pbVar7 + 2) << 8 | *(ushort *)(pbVar7 + 2) >> 8;
        pcVar10 = (char *)(ulong)uVar4;
        uVar9 = (ulong)pbVar7[4];
        pcVar15 = NscGetActionName((uint)uVar4,local_648);
        sprintf(local_6e8,"%02X 00 %04X %02X",5,pcVar10,uVar9);
        pcVar8 = "ACTION %s(%04X), %02X";
        goto LAB_00147511;
      case 6:
        goto switchD_00146b7c_caseD_6;
      case 7:
        pcVar15 = "LOGOR";
        goto switchD_00146b7c_caseD_6;
      case 8:
        pcVar15 = "INCOR";
        goto switchD_00146b7c_caseD_6;
      case 9:
        pcVar15 = "EXCOR";
        goto switchD_00146b7c_caseD_6;
      case 10:
        pcVar15 = "BOOLAND";
        goto switchD_00146b7c_caseD_6;
      case 0xb:
        pcVar15 = "EQUAL";
        goto switchD_00146b7c_caseD_6;
      case 0xc:
        pcVar15 = "NEQUAL";
        goto switchD_00146b7c_caseD_6;
      case 0xd:
        pcVar15 = "GEQ";
        goto switchD_00146b7c_caseD_6;
      case 0xe:
        pcVar15 = "GT";
        goto switchD_00146b7c_caseD_6;
      case 0xf:
        pcVar15 = "LT";
        goto switchD_00146b7c_caseD_6;
      case 0x10:
        pcVar15 = "LEQ";
        goto switchD_00146b7c_caseD_6;
      case 0x11:
        pcVar15 = "SHLEFT";
        goto switchD_00146b7c_caseD_6;
      case 0x12:
        pcVar15 = "SHRIGHT";
        goto switchD_00146b7c_caseD_6;
      case 0x13:
        pcVar15 = "USHRIGHT";
        goto switchD_00146b7c_caseD_6;
      case 0x14:
        pcVar15 = "ADD";
        goto switchD_00146b7c_caseD_6;
      case 0x15:
        pcVar15 = "SUB";
        goto switchD_00146b7c_caseD_6;
      case 0x16:
        pcVar15 = "MUL";
        goto switchD_00146b7c_caseD_6;
      case 0x17:
        pcVar15 = "DIV";
        goto switchD_00146b7c_caseD_6;
      case 0x18:
        pcVar15 = "MOD";
switchD_00146b7c_caseD_6:
        pbVar13 = pbVar7 + 2;
        if (pbVar5 < pbVar13) break;
        bVar1 = *pbVar6;
        GetOpText(bVar1,local_668);
        if (bVar1 == 0x24) {
          pbVar12 = pbVar7 + 4;
          pbVar6 = pbVar13;
          if (pbVar5 < pbVar12) break;
          uVar9 = (ulong)(ushort)(*(ushort *)(pbVar7 + 2) << 8 | *(ushort *)(pbVar7 + 2) >> 8);
          sprintf(local_6e8,"%02X %02X %04X",uVar11,0x24,uVar9);
          pcVar8 = "%s%s %04X";
          pcVar10 = local_668;
LAB_00147511:
          sprintf((char *)&local_638,pcVar8,pcVar15,pcVar10,uVar9);
          pbVar13 = pbVar12;
        }
        else {
          sprintf(local_6e8,"%02X %02X",uVar11,(ulong)bVar1);
          sprintf((char *)&local_638,"%s%s",pcVar15,local_668);
        }
        goto LAB_0014751d;
      case 0x19:
        pcVar10 = "NEG";
        goto switchD_00146b7c_caseD_2;
      case 0x1a:
        pcVar10 = "COMP";
        goto switchD_00146b7c_caseD_2;
      case 0x1b:
        pbVar13 = pbVar7 + 6;
        if ((pbVar5 < pbVar13) || (*pbVar6 != 0)) break;
        uVar3 = *(uint *)(pbVar7 + 2);
        pbVar6 = (byte *)(ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                                uVar3 << 0x18);
        sprintf(local_6e8,"%02X 00 %08X",0x1b,pbVar6);
        pcVar10 = "MOVSP %08X";
LAB_00147494:
        sprintf((char *)&local_638,pcVar10,pbVar6);
        goto LAB_0014751d;
      case 0x1c:
        pbVar13 = pbVar7 + 2;
        if (pbVar13 <= pbVar5) {
          pbVar6 = (byte *)(ulong)*pbVar6;
          sprintf(local_6e8,"%02X %02X",0x1c,pbVar6);
          pcVar10 = "SAVE_STATEALL %02x";
          goto LAB_00147494;
        }
        break;
      case 0x1d:
        if ((pbVar7 + 6 <= pbVar5) && (*pbVar6 == 0)) {
          uVar3 = *(uint *)(pbVar7 + 2);
          uVar11 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                          uVar3 << 0x18);
          sprintf(local_6e8,"%02X 00 %08X",0x1d,uVar11);
          pbVar6 = pbVar7 + (uVar11 - (long)pauchData);
          pcVar10 = "JMP off_%08X";
LAB_001470a6:
          pbVar13 = pbVar7 + 6;
          goto LAB_00147494;
        }
        break;
      case 0x1e:
        if ((pbVar7 + 6 <= pbVar5) && (*pbVar6 == 0)) {
          uVar3 = *(uint *)(pbVar7 + 2);
          uVar11 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                          uVar3 << 0x18);
          sprintf(local_6e8,"%02X 00 %08X",0x1e,uVar11);
          pbVar6 = pbVar7 + (uVar11 - (long)pauchData);
          pcVar10 = "JSR fn_%08X";
          goto LAB_001470a6;
        }
        break;
      case 0x1f:
        if ((pbVar7 + 6 <= pbVar5) && (*pbVar6 == 0)) {
          uVar3 = *(uint *)(pbVar7 + 2);
          uVar11 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                          uVar3 << 0x18);
          sprintf(local_6e8,"%02X 00 %08X",0x1f,uVar11);
          pbVar6 = pbVar7 + (uVar11 - (long)pauchData);
          pcVar10 = "JZ off_%08X";
          goto LAB_001470a6;
        }
        break;
      case 0x20:
        pbVar13 = pbVar7 + 2;
        if ((pbVar13 <= pbVar5) && (*pbVar6 == 0)) {
          sprintf(local_6e8,"%02X 00",0x20);
          local_638 = CONCAT35(local_638._5_3_,0x4e544552);
          goto LAB_0014751d;
        }
        break;
      case 0x21:
        pbVar12 = pbVar7 + 8;
        if ((pbVar12 <= pbVar5) && (*pbVar6 == 1)) {
          pcVar15 = (char *)(ulong)(ushort)(*(ushort *)(pbVar7 + 2) << 8 |
                                           *(ushort *)(pbVar7 + 2) >> 8);
          pcVar10 = (char *)(ulong)(ushort)(*(ushort *)(pbVar7 + 4) << 8 |
                                           *(ushort *)(pbVar7 + 4) >> 8);
          uVar9 = (ulong)(ushort)(*(ushort *)(pbVar7 + 6) << 8 | *(ushort *)(pbVar7 + 6) >> 8);
          sprintf(local_6e8,"%02X 01 %04X %04X %04x",0x21,pcVar15,pcVar10,uVar9);
          pcVar8 = "DESTRUCT %04X, %04X, %04X";
          goto LAB_00147511;
        }
        break;
      case 0x22:
        pcVar10 = "NOT";
switchD_00146b7c_caseD_2:
        pbVar13 = pbVar7 + 2;
        if (pbVar5 < pbVar13) break;
        bVar1 = *pbVar6;
        pcVar15 = local_668;
        GetOpText(bVar1,pcVar15);
        sprintf(local_6e8,"%02X %02X",uVar11,(ulong)bVar1);
        pcVar8 = "%s%s";
LAB_00147212:
        sprintf((char *)&local_638,pcVar8,pcVar10,pcVar15);
        goto LAB_0014751d;
      case 0x23:
        pbVar13 = pbVar7 + 6;
        if ((pbVar13 <= pbVar5) && (*pbVar6 == 3)) {
          uVar3 = *(uint *)(pbVar7 + 2);
          pbVar6 = (byte *)(ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                                  uVar3 << 0x18);
          sprintf(local_6e8,"%02X 03 %08X",0x23,pbVar6);
          pcVar10 = "DECISP %08X";
          goto LAB_00147494;
        }
        break;
      case 0x24:
        pbVar13 = pbVar7 + 6;
        if ((pbVar13 <= pbVar5) && (*pbVar6 == 3)) {
          uVar3 = *(uint *)(pbVar7 + 2);
          pbVar6 = (byte *)(ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                                  uVar3 << 0x18);
          sprintf(local_6e8,"%02X 03 %08X",0x24,pbVar6);
          pcVar10 = "INCISP %08X";
          goto LAB_00147494;
        }
        break;
      case 0x25:
        if ((pbVar7 + 6 <= pbVar5) && (*pbVar6 == 0)) {
          uVar3 = *(uint *)(pbVar7 + 2);
          uVar11 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                          uVar3 << 0x18);
          sprintf(local_6e8,"%02X 00 %08X",0x25,uVar11);
          pbVar6 = pbVar7 + (uVar11 - (long)pauchData);
          pcVar10 = "JNZ off_%08X";
          goto LAB_001470a6;
        }
        break;
      case 0x26:
        if ((pbVar7 + 8 <= pbVar5) && (*pbVar6 == 1)) {
          uVar3 = *(uint *)(pbVar7 + 2);
          pcVar10 = (char *)(ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8
                                   | uVar3 << 0x18);
          pcVar15 = (char *)(ulong)(ushort)(*(ushort *)(pbVar7 + 6) << 8 |
                                           *(ushort *)(pbVar7 + 6) >> 8);
          sprintf(local_6e8,"%02X 01 %08X %04X",0x26,pcVar10,pcVar15);
          pcVar8 = "CPDOWNBP %08X, %04X";
          goto LAB_00147204;
        }
        break;
      case 0x27:
        if ((pbVar7 + 8 <= pbVar5) && (*pbVar6 == 1)) {
          uVar3 = *(uint *)(pbVar7 + 2);
          pcVar10 = (char *)(ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8
                                   | uVar3 << 0x18);
          pcVar15 = (char *)(ulong)(ushort)(*(ushort *)(pbVar7 + 6) << 8 |
                                           *(ushort *)(pbVar7 + 6) >> 8);
          sprintf(local_6e8,"%02X 01 %08X %04X",0x27,pcVar10,pcVar15);
          pcVar8 = "CPTOPBP %08X, %04X";
          goto LAB_00147204;
        }
        break;
      case 0x28:
        pbVar13 = pbVar7 + 6;
        if ((pbVar13 <= pbVar5) && (*pbVar6 == 3)) {
          uVar3 = *(uint *)(pbVar7 + 2);
          pbVar6 = (byte *)(ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                                  uVar3 << 0x18);
          sprintf(local_6e8,"%02X 03 %08X",0x28,pbVar6);
          pcVar10 = "DECIBP %08X";
          goto LAB_00147494;
        }
        break;
      case 0x29:
        pbVar13 = pbVar7 + 6;
        if ((pbVar13 <= pbVar5) && (*pbVar6 == 3)) {
          uVar3 = *(uint *)(pbVar7 + 2);
          pbVar6 = (byte *)(ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                                  uVar3 << 0x18);
          sprintf(local_6e8,"%02X 03 %08X",0x29,pbVar6);
          pcVar10 = "INCIBP %08X";
          goto LAB_00147494;
        }
        break;
      case 0x2a:
        pbVar13 = pbVar7 + 2;
        if ((pbVar13 <= pbVar5) && (*pbVar6 == 0)) {
          sprintf(local_6e8,"%02X 00",0x2a);
          local_638 = CONCAT17(local_638._7_1_,0x504245564153);
          goto LAB_0014751d;
        }
        break;
      case 0x2b:
        pbVar13 = pbVar7 + 2;
        if ((pbVar13 <= pbVar5) && (*pbVar6 == 0)) {
          sprintf(local_6e8,"%02X 00",0x2b);
          local_638 = 0x4245524f54534552;
          local_630 = 0x50;
          goto LAB_0014751d;
        }
        break;
      case 0x2c:
        pbVar12 = pbVar7 + 10;
        if (pbVar12 <= pbVar5) {
          pcVar15 = (char *)(ulong)pbVar7[1];
          uVar3 = *(uint *)(pbVar7 + 2);
          uVar2 = *(uint *)(pbVar7 + 6);
          pcVar10 = (char *)(ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8
                                   | uVar3 << 0x18);
          uVar9 = (ulong)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                         uVar2 << 0x18);
          sprintf(local_6e8,"%02X %02X %08X %08X",0x2c,pcVar15,pcVar10,uVar9);
          pcVar8 = "STORE_STATE %02X, %08X, %08X";
          goto LAB_00147511;
        }
        break;
      case 0x2d:
        if ((pbVar7 + 2 <= pbVar5) && (*pbVar6 == 0)) {
          sprintf(local_6e8,"%02X 00",0x2d);
          local_638 = CONCAT44(local_638._4_4_,0x504f4e);
          pbVar13 = pbVar7 + 2;
          goto LAB_0014751d;
        }
        break;
      case 0x42:
        pbVar13 = pbVar7 + 5;
        if (pbVar13 <= pbVar5) {
          uVar3 = *(uint *)(pbVar7 + 1);
          pbVar6 = (byte *)(ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                                  uVar3 << 0x18);
          sprintf(local_6e8,"%02X %08X",0x42,pbVar6);
          pcVar10 = "T %08X";
          goto LAB_00147494;
        }
      }
      sprintf(local_6e8,"%02X",uVar11);
      local_638 = CONCAT53(local_638._3_5_,0x3f3f);
      pbVar13 = pbVar6;
LAB_0014751d:
      sprintf(local_438,"%08X %-24s %s",(long)pbVar7 - (long)pauchData,local_6e8,&local_638);
      (*local_640->_vptr_CNwnStream[6])(local_640,local_438,1);
      pbVar7 = pbVar13;
    } while (pbVar13 < pbVar5);
  }
  return;
}

Assistant:

void NscScriptDecompile (CNwnStream &sStream, 
	unsigned char *pauchData, unsigned long ulSize, NscCompiler *pCompiler)
{

	//
	// Loop through the data
	//

	unsigned char *pStart = pauchData;
	unsigned char *pEnd = &pauchData [ulSize];
	unsigned char *pData = pStart;
	pData += 8;
	while (pData < pEnd)
	{
		char szByteText [128];
		char szOpText [512];
		char szOpType [32];
		char *pszOpRoot;

		//
		// Switch based on the next opcode
		//

		unsigned char *pOp = pData;
		unsigned char cOp = *pData++;
		switch (cOp)
		{

			case NscCode_CPDOWNSP:
				{
					if (&pData [7] > pEnd || pData [0] != 1)
						goto invalid_op;
					unsigned long ul1, ul2;
					pData = GetUINT32 (pData + 1, &ul1);
					pData = GetUINT16 (pData, &ul2);
					sprintf (szByteText, "%02X 01 %08X %04X", cOp, ul1, ul2);
					sprintf (szOpText, "CPDOWNSP %08X, %04X", ul1, ul2);
				}
				break;

			case NscCode_RSADD:
				pszOpRoot = "RSADD";
do_simple_operator:;
				{
					if (&pData [1] > pEnd)
						goto invalid_op;
					unsigned char cOpType = *pData++;
					GetOpText (cOpType, szOpType);
					sprintf (szByteText, "%02X %02X", cOp, cOpType);
					sprintf (szOpText, "%s%s", pszOpRoot, szOpType);
				}
				break;

			case NscCode_CPTOPSP:
				{
					if (&pData [7] > pEnd || pData [0] != 1)
						goto invalid_op;
					unsigned long ul1, ul2;
					pData = GetUINT32 (pData + 1, &ul1);
					pData = GetUINT16 (pData, &ul2);
					sprintf (szByteText, "%02X 01 %08X %04X", cOp, ul1, ul2);
					sprintf (szOpText, "CPTOPSP %08X, %04X", ul1, ul2);
				}
				break;

			case NscCode_CONST:
				{
					if (&pData [1] > pEnd)
						goto invalid_op;
					unsigned char cOpType = *pData;
					GetOpText (cOpType, szOpType);
					switch (cOpType)
					{
						case 3:
						case 6:
							{
								if (&pData [5] > pEnd)
									goto invalid_op;
								unsigned long ul;
								pData = GetUINT32 (pData + 1, &ul);
								sprintf (szByteText, "%02X %02X %08X", cOp, cOpType, ul);
								sprintf (szOpText, "CONST%s %08X", szOpType, ul);
							}
							break;

						case 4:
							{
								if (&pData [5] > pEnd)
									goto invalid_op;
								union
								{
									unsigned long ul;
									float f;
								} val;
								pData = GetFLOAT (pData + 1, &val .f);
								sprintf (szByteText, "%02X %02X %08X", cOp, cOpType, val .ul);
								sprintf (szOpText, "CONST%s %f", szOpType, val .f);
							}
							break;

						case 5:
							{
								if (&pData [3] > pEnd)
									goto invalid_op;
								unsigned long ul;
								GetUINT16 (pData + 1, &ul);
								if (&pData [3 + ul] > pEnd)
									goto invalid_op;
								pData += 3;
								char szValue [129];
								unsigned long ulCopy = ul > 128 ? 128 : ul;
								memmove (szValue, pData, ulCopy);
								szValue [ulCopy] = 0;
								sprintf (szByteText, "%02X %02X %04X str", cOp, cOpType, ul);
								snprintf (szOpText, _countof (szOpText), 
									"CONST%s \"%s\"", szOpType, szValue);
								pData += ul;
							}
							break;

						default:
							goto invalid_op;
					}
				}
				break;

			case NscCode_ACTION:
				{
					if (&pData [4] > pEnd || pData [0] != 0)
						goto invalid_op;
					unsigned long ul1, ul2;
					pData = GetUINT16 (pData + 1, &ul1);
					ul2 = *pData++;
					const char *pszName = NscGetActionName ((int) ul1, pCompiler);
					sprintf (szByteText, "%02X 00 %04X %02X", cOp, ul1, ul2);
					sprintf (szOpText, "ACTION %s(%04X), %02X", pszName, ul1, ul2);
				}
				break;

			case NscCode_LOGAND:
				pszOpRoot = "LOGAND";
do_binary_operator:;
				{
					if (&pData [1] > pEnd)
						goto invalid_op;
					unsigned char cOpType = *pData++;
					GetOpText (cOpType, szOpType);
					if (cOpType == 0x24)
					{
						if (&pData [2] > pEnd)
							goto invalid_op;
						unsigned long ul1;
						pData = GetUINT16 (pData, &ul1);
						sprintf (szByteText, "%02X %02X %04X", cOp, cOpType, ul1);
						sprintf (szOpText, "%s%s %04X", pszOpRoot, szOpType, ul1);
					}
					else
					{
						sprintf (szByteText, "%02X %02X", cOp, cOpType);
						sprintf (szOpText, "%s%s", pszOpRoot, szOpType);
					}
				}
				break;

			case NscCode_LOGOR:
				pszOpRoot = "LOGOR";
				goto do_binary_operator;

			case NscCode_INCOR:
				pszOpRoot = "INCOR";
				goto do_binary_operator;

			case NscCode_EXCOR:
				pszOpRoot = "EXCOR";
				goto do_binary_operator;

			case NscCode_BOOLAND:
				pszOpRoot = "BOOLAND";
				goto do_binary_operator;

			case NscCode_EQUAL:
				pszOpRoot = "EQUAL";
				goto do_binary_operator;

			case NscCode_NEQUAL:
				pszOpRoot = "NEQUAL";
				goto do_binary_operator;

			case NscCode_GEQ:
				pszOpRoot = "GEQ";
				goto do_binary_operator;

			case NscCode_GT:
				pszOpRoot = "GT";
				goto do_binary_operator;

			case NscCode_LT:
				pszOpRoot = "LT";
				goto do_binary_operator;

			case NscCode_LEQ:
				pszOpRoot = "LEQ";
				goto do_binary_operator;

			case NscCode_SHLEFT:
				pszOpRoot = "SHLEFT";
				goto do_binary_operator;

			case NscCode_SHRIGHT:
				pszOpRoot = "SHRIGHT";
				goto do_binary_operator;

			case NscCode_USHRIGHT:
				pszOpRoot = "USHRIGHT";
				goto do_binary_operator;

			case NscCode_ADD:
				pszOpRoot = "ADD";
				goto do_binary_operator;

			case NscCode_SUB:
				pszOpRoot = "SUB";
				goto do_binary_operator;

			case NscCode_MUL:
				pszOpRoot = "MUL";
				goto do_binary_operator;

			case NscCode_DIV:
				pszOpRoot = "DIV";
				goto do_binary_operator;

			case NscCode_MOD:
				pszOpRoot = "MOD";
				goto do_binary_operator;

			case NscCode_NEG:
				pszOpRoot = "NEG";
				goto do_simple_operator;

			case NscCode_COMP:
				pszOpRoot = "COMP";
				goto do_simple_operator;

			case NscCode_MOVSP:
				{
					if (&pData [5] > pEnd || pData [0] != 0)
						goto invalid_op;
					unsigned long ul1;
					pData = GetUINT32 (pData + 1, &ul1);
					sprintf (szByteText, "%02X 00 %08X", cOp, ul1);
					sprintf (szOpText, "MOVSP %08X", ul1);
				}
				break;

			case NscCode_STORE_STATEALL:
				{
					if (&pData [1] > pEnd)
						goto invalid_op;
					unsigned long ul = *pData++;
					sprintf (szByteText, "%02X %02X", cOp, ul);
					sprintf (szOpText, "SAVE_STATEALL %02x", ul);
				}
				break;

			case NscCode_JMP:
				{
					if (&pData [5] > pEnd || pData [0] != 0)
						goto invalid_op;
					unsigned long ul1;
					pData = GetUINT32 (pData + 1, &ul1);
					sprintf (szByteText, "%02X 00 %08X", cOp, ul1);
					sprintf (szOpText, "JMP off_%08X", (pOp - pStart) + ul1);
				}
				break;

			case NscCode_JSR:
				{
					if (&pData [5] > pEnd || pData [0] != 0)
						goto invalid_op;
					unsigned long ul1;
					pData = GetUINT32 (pData + 1, &ul1);
					sprintf (szByteText, "%02X 00 %08X", cOp, ul1);
					sprintf (szOpText, "JSR fn_%08X", (pOp - pStart) + ul1);
				}
				break;

			case NscCode_JZ:
				{
					if (&pData [5] > pEnd || pData [0] != 0)
						goto invalid_op;
					unsigned long ul1;
					pData = GetUINT32 (pData + 1, &ul1);
					sprintf (szByteText, "%02X 00 %08X", cOp, ul1);
					sprintf (szOpText, "JZ off_%08X", (pOp - pStart) + ul1);
				}
				break;

			case NscCode_RETN:
				{
					if (&pData [1] > pEnd || pData [0] != 0)
						goto invalid_op;
					pData++;
					sprintf (szByteText, "%02X 00", cOp);
					sprintf (szOpText, "RETN");
				}
				break;

			case NscCode_DESTRUCT:
				{
					if (&pData [7] > pEnd || pData [0] != 1)
						goto invalid_op;
					unsigned long ul1, ul2, ul3;
					pData = GetUINT16 (pData + 1, &ul1);
					pData = GetUINT16 (pData, &ul2);
					pData = GetUINT16 (pData, &ul3);
					sprintf (szByteText, "%02X 01 %04X %04X %04x", cOp, ul1, ul2, ul3);
					sprintf (szOpText, "DESTRUCT %04X, %04X, %04X", ul1, ul2, ul3);
					// First parameter, number of bytes to destroy
					// Second parameter, offset of element not to destroy
					// Third parameter, number of bytes no to destroy
				}
				break;

			case NscCode_NOT:
				pszOpRoot = "NOT";
				goto do_simple_operator;

			case NscCode_DECISP:
				{
					if (&pData [5] > pEnd || pData [0] != 3)
						goto invalid_op;
					unsigned long ul1;
					pData = GetUINT32 (pData + 1, &ul1);
					sprintf (szByteText, "%02X 03 %08X", cOp, ul1);
					sprintf (szOpText, "DECISP %08X", ul1);
				}
				break;

			case NscCode_INCISP:
				{
					if (&pData [5] > pEnd || pData [0] != 3)
						goto invalid_op;
					unsigned long ul1;
					pData = GetUINT32 (pData + 1, &ul1);
					sprintf (szByteText, "%02X 03 %08X", cOp, ul1);
					sprintf (szOpText, "INCISP %08X", ul1);
				}
				break;

			case NscCode_JNZ:
				{
					if (&pData [5] > pEnd || pData [0] != 0)
						goto invalid_op;
					unsigned long ul1;
					pData = GetUINT32 (pData + 1, &ul1);
					sprintf (szByteText, "%02X 00 %08X", cOp, ul1);
					sprintf (szOpText, "JNZ off_%08X", (pOp - pStart) + ul1);
				}
				break;

			case NscCode_CPDOWNBP:
				{
					if (&pData [7] > pEnd || pData [0] != 1)
						goto invalid_op;
					unsigned long ul1, ul2;
					pData = GetUINT32 (pData + 1, &ul1);
					pData = GetUINT16 (pData, &ul2);
					sprintf (szByteText, "%02X 01 %08X %04X", cOp, ul1, ul2);
					sprintf (szOpText, "CPDOWNBP %08X, %04X", ul1, ul2);
				}
				break;

			case NscCode_CPTOPBP:
				{
					if (&pData [7] > pEnd || pData [0] != 1)
						goto invalid_op;
					unsigned long ul1, ul2;
					pData = GetUINT32 (pData + 1, &ul1);
					pData = GetUINT16 (pData, &ul2);
					sprintf (szByteText, "%02X 01 %08X %04X", cOp, ul1, ul2);
					sprintf (szOpText, "CPTOPBP %08X, %04X", ul1, ul2);
				}
				break;

			case NscCode_DECIBP:
				{
					if (&pData [5] > pEnd || pData [0] != 3)
						goto invalid_op;
					unsigned long ul1;
					pData = GetUINT32 (pData + 1, &ul1);
					sprintf (szByteText, "%02X 03 %08X", cOp, ul1);
					sprintf (szOpText, "DECIBP %08X", ul1);
				}
				break;

			case NscCode_INCIBP:
				{
					if (&pData [5] > pEnd || pData [0] != 3)
						goto invalid_op;
					unsigned long ul1;
					pData = GetUINT32 (pData + 1, &ul1);
					sprintf (szByteText, "%02X 03 %08X", cOp, ul1);
					sprintf (szOpText, "INCIBP %08X", ul1);
				}
				break;

			case NscCode_SAVEBP:
				{
					if (&pData [1] > pEnd || pData [0] != 0)
						goto invalid_op;
					pData++;
					sprintf (szByteText, "%02X 00", cOp);
					sprintf (szOpText, "SAVEBP");
				}
				break;

			case NscCode_RESTOREBP:
				{
					if (&pData [1] > pEnd || pData [0] != 0)
						goto invalid_op;
					pData++;
					sprintf (szByteText, "%02X 00", cOp);
					sprintf (szOpText, "RESTOREBP");
				}
				break;

			case NscCode_STORE_STATE:
				{
					if (&pData [9] > pEnd)
						goto invalid_op;
					unsigned long ul1, ul2, ul3;
					ul3 = *pData++;
					pData = GetUINT32 (pData, &ul1);
					pData = GetUINT32 (pData, &ul2);
					sprintf (szByteText, "%02X %02X %08X %08X", cOp, ul3, ul1, ul2);
					sprintf (szOpText, "STORE_STATE %02X, %08X, %08X", ul3, ul1, ul2);
				    // First value is BP stack size to save
					// second value is SP stack size to save
				}
				break;

			case NscCode_NOP:
				{
					if (&pData [1] > pEnd || pData [0] != 0)
						goto invalid_op;
					pData++;
					sprintf (szByteText, "%02X 00", cOp);
					sprintf (szOpText, "NOP");
				}
				break;

			case NscCode_Size:
				{
					if (&pData [4] > pEnd)
						goto invalid_op;
					unsigned long ul;
					pData = GetUINT32 (pData, &ul);
					sprintf (szByteText, "%02X %08X", cOp, ul);
					sprintf (szOpText, "T %08X", ul);
				}
				break;

			default:
invalid_op:;
				sprintf (szByteText, "%02X", cOp);
				sprintf (szOpText, "??");
				//if (g_fpDebug)
				//	fprintf (g_fpDebug, "Unknown opcode %02x\r\n", cOp);
				break;
		}

		//
		// Format the final line
		//

		char szText [1024];
		sprintf (szText, "%08X %-24s %s", pOp - pStart, szByteText, szOpText);
		sStream .WriteLine (szText);
	}
}